

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleParallelNoClockAnalyzerSettings.cpp
# Opt level: O2

char * __thiscall SimpleParallelAnalyzerSettings::SaveSettings(SimpleParallelAnalyzerSettings *this)

{
  pointer pCVar1;
  pointer pCVar2;
  char *pcVar3;
  ulong uVar4;
  SimpleArchive text_archive;
  SimpleArchive aSStack_28 [8];
  
  SimpleArchive::SimpleArchive(aSStack_28);
  pCVar1 = (this->mDataChannels).super__Vector_base<Channel,_std::allocator<Channel>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pCVar2 = (this->mDataChannels).super__Vector_base<Channel,_std::allocator<Channel>_>._M_impl.
           super__Vector_impl_data._M_start;
  for (uVar4 = 0; ((long)pCVar1 - (long)pCVar2 & 0xffffffff0U) != uVar4; uVar4 = uVar4 + 0x10) {
    SimpleArchive::operator<<
              (aSStack_28,
               (this->mDataChannels).super__Vector_base<Channel,_std::allocator<Channel>_>._M_impl.
               super__Vector_impl_data._M_start + uVar4);
  }
  SimpleArchive::operator<<(aSStack_28,&this->mClockChannel);
  SimpleArchive::operator<<(aSStack_28,this->mClockEdge);
  SimpleArchive::GetString();
  pcVar3 = (char *)AnalyzerSettings::SetReturnString((char *)this);
  SimpleArchive::~SimpleArchive(aSStack_28);
  return pcVar3;
}

Assistant:

const char* SimpleParallelAnalyzerSettings::SaveSettings()
{
	SimpleArchive text_archive;

		U32 count = (U32)mDataChannels.size();

	for( U32 i=0; i<count; i++ )
	{
		text_archive << mDataChannels[i];
	}

	text_archive << mClockChannel;
	text_archive << mClockEdge;

	return SetReturnString( text_archive.GetString() );
}